

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderVectorFields(SwiftGenerator *this,FieldDef *field)

{
  bool bVar1;
  size_t t;
  char *pcVar2;
  reference ppFVar3;
  byte local_881;
  FieldDef *key_field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_808;
  const_iterator kit;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  StructDef *sd;
  string local_7e8;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  string local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  string local_688;
  string local_668;
  allocator<char> local_641;
  string local_640;
  string local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  undefined4 local_47c;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  char *local_240;
  char *nullable;
  string local_230;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  Type vectortype;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string const_string;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  const_string.field_2._8_8_ = field;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"return o == 0 ? {{CONSTANT}} : ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  Type::VectorType((Type *)local_70,(Type *)(const_string.field_2._8_8_ + 200));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"SIZE",&local_91);
  t = InlineSize((Type *)local_70);
  NumToString<unsigned_long>(&local_b8,t);
  CodeWriter::SetValue(&this->code_,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"HAS_FIELDVAR",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"has",&local_121);
  Namer::Variable<flatbuffers::FieldDef>
            (&local_100,&(this->namer_).super_Namer,&local_120,
             (FieldDef *)const_string.field_2._8_8_);
  CodeWriter::SetValue(&this->code_,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  GenOffset_abi_cxx11_(&local_188,this);
  std::operator+(&local_168,"{{ACCESS_TYPE}} var {{HAS_FIELDVAR}}: Bool { ",&local_188);
  std::operator+(&local_148,&local_168,"return o == 0 ? false : true }");
  CodeWriter::operator+=(&this->code_,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  GenOffset_abi_cxx11_(&local_1e8,this);
  std::operator+(&local_1c8,"{{ACCESS_TYPE}} var {{FIELDVAR}}Count: Int32 { ",&local_1e8);
  std::operator+(&local_1a8,&local_1c8,"return o == 0 ? 0 : {{ACCESS}}.vector(count: o) }");
  CodeWriter::operator+=(&this->code_,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"CONSTANT",&local_209);
  bVar1 = IsScalar(local_70._0_4_);
  pcVar2 = "nil";
  if (bVar1) {
    pcVar2 = "0";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,pcVar2,(allocator<char> *)((long)&nullable + 7));
  CodeWriter::SetValue(&this->code_,&local_208,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)((long)&nullable + 7));
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  bVar1 = IsScalar(local_70._0_4_);
  local_881 = 0;
  if (bVar1) {
    bVar1 = IsEnum((Type *)local_70);
    local_881 = bVar1 ^ 0xff;
  }
  pcVar2 = "?";
  if ((local_881 & 1) != 0) {
    pcVar2 = "";
  }
  local_240 = pcVar2;
  if (local_70._0_4_ == BASE_TYPE_UNION) {
    GenOffset_abi_cxx11_(&local_348,this);
    std::operator+(&local_328,
                   "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(at index: Int32, type: T.Type) -> T? { "
                   ,&local_348);
    std::operator+(&local_308,&local_328,"\\");
    CodeWriter::operator+=(&this->code_,&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,pcVar2,&local_2c1);
    anon_unknown_1::GenArrayMainBody(&local_2a0,&local_2c0);
    GenOffset_abi_cxx11_(&local_2e8,this);
    std::operator+(&local_280,&local_2a0,&local_2e8);
    std::operator+(&local_260,&local_280,"\\");
    CodeWriter::operator+=(&this->code_,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
  }
  bVar1 = IsBool(local_70._0_4_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"CONSTANT",&local_369);
    pcVar2 = "true";
    if (*(short *)(const_string.field_2._8_8_ + 0x108) == 0) {
      pcVar2 = "false";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,pcVar2,&local_391);
    CodeWriter::SetValue(&this->code_,&local_368,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"VALUETYPE",&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"Bool",&local_3e1);
    CodeWriter::SetValue(&this->code_,&local_3b8,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
  }
  bVar1 = IsEnum((Type *)local_70);
  if (!bVar1) {
    std::operator+(&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "\\");
    CodeWriter::operator+=(&this->code_,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
  }
  bVar1 = IsScalar(local_70._0_4_);
  if (((!bVar1) || (bVar1 = IsEnum((Type *)local_70), bVar1)) ||
     (bVar1 = IsBool(*(BaseType *)(const_string.field_2._8_8_ + 200)), bVar1)) {
    if ((local_70._0_4_ == BASE_TYPE_STRUCT) &&
       ((*(byte *)(*(long *)(const_string.field_2._8_8_ + 0xd0) + 0x110) & 1) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,
                 "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
                 ,&local_4a1);
      CodeWriter::operator+=(&this->code_,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator(&local_4a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"FIELDMETHOD",&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"mutable",&local_511);
      IdlNamer::Method(&local_4f0,&this->namer_,&local_510,(FieldDef *)const_string.field_2._8_8_);
      CodeWriter::SetValue(&this->code_,&local_4c8,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_538,"VALUETYPE",&local_539);
      GenType_abi_cxx11_(&local_580,this,(Type *)(const_string.field_2._8_8_ + 200),false);
      Mutable_abi_cxx11_(&local_5a0,this);
      std::operator+(&local_560,&local_580,&local_5a0);
      CodeWriter::SetValue(&this->code_,&local_538,&local_560);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::__cxx11::string::~string((string *)&local_580);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      pcVar2 = local_240;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,pcVar2,&local_641);
      anon_unknown_1::GenArrayMainBody(&local_620,&local_640);
      GenOffset_abi_cxx11_(&local_668,this);
      std::operator+(&local_600,&local_620,&local_668);
      std::operator+(&local_5e0,&local_600,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,"{{ACCESS}}.vector(at: o) + index * {{SIZE}}",&local_6a9);
      GenConstructor(&local_688,this,&local_6a8);
      std::operator+(&local_5c0,&local_5e0,&local_688);
      CodeWriter::operator+=(&this->code_,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)&local_688);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_620);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator(&local_641);
      local_47c = 1;
    }
    else {
      bVar1 = IsString((Type *)local_70);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d0,
                   "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }",
                   &local_6d1);
        CodeWriter::operator+=(&this->code_,&local_6d0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::allocator<char>::~allocator(&local_6d1);
        local_47c = 1;
      }
      else {
        bVar1 = IsEnum((Type *)local_70);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"BASEVALUE",&local_6f9);
          GenTypeBasic_abi_cxx11_(&local_720,this,(Type *)local_70,false);
          CodeWriter::SetValue(&this->code_,&local_6f8,&local_720);
          std::__cxx11::string::~string((string *)&local_720);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::allocator<char>::~allocator(&local_6f9);
          GenEnumDefaultValue_abi_cxx11_(&local_780,this,(FieldDef *)const_string.field_2._8_8_);
          std::operator+(&local_760,"return o == 0 ? {{VALUETYPE}}",&local_780);
          std::operator+(&local_740,&local_760,
                         " : {{VALUETYPE}}(rawValue: {{ACCESS}}.directRead(of: {{BASEVALUE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}})) }"
                        );
          CodeWriter::operator+=(&this->code_,&local_740);
          std::__cxx11::string::~string((string *)&local_740);
          std::__cxx11::string::~string((string *)&local_760);
          std::__cxx11::string::~string((string *)&local_780);
          local_47c = 1;
        }
        else if (local_70._0_4_ == BASE_TYPE_UNION) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7a0,
                     "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + index * {{SIZE}}) }",
                     &local_7a1);
          CodeWriter::operator+=(&this->code_,&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          std::allocator<char>::~allocator(&local_7a1);
          local_47c = 1;
        }
        else {
          if ((local_70._0_4_ == BASE_TYPE_STRUCT) &&
             ((*(byte *)(*(long *)(const_string.field_2._8_8_ + 0xd0) + 0x110) & 1) == 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7e8,
                       "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * {{SIZE}})",
                       (allocator<char> *)((long)&sd + 7));
            GenConstructor(&local_7c8,this,&local_7e8);
            CodeWriter::operator+=(&this->code_,&local_7c8);
            std::__cxx11::string::~string((string *)&local_7c8);
            std::__cxx11::string::~string((string *)&local_7e8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&sd + 7));
            kit._M_current = (FieldDef **)(*(long *)(const_string.field_2._8_8_ + 0xd0) + 0xf8);
            local_808._M_current =
                 (FieldDef **)
                 std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                 begin((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       kit._M_current);
            while( true ) {
              key_field = (FieldDef *)
                          std::
                          vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ::end((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                 *)kit._M_current);
              bVar1 = __gnu_cxx::operator!=
                                (&local_808,
                                 (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                  *)&key_field);
              if (!bVar1) break;
              ppFVar3 = __gnu_cxx::
                        __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        ::operator*(&local_808);
              if (((*ppFVar3)->key & 1U) != 0) {
                GenByKeyFunctions(this,*ppFVar3);
                break;
              }
              __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator++(&local_808);
            }
          }
          local_47c = 0;
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,
               "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: {{ACCESS}}.vector(at: o) + index * {{SIZE}}) }"
               ,&local_429);
    CodeWriter::operator+=(&this->code_,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,
               "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return {{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }"
               ,&local_451);
    CodeWriter::operator+=(&this->code_,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    if (((((this->super_BaseGenerator).parser_)->opts).mutable_buffer & 1U) != 0) {
      GenMutateArray_abi_cxx11_(&local_478,this);
      CodeWriter::operator+=(&this->code_,&local_478);
      std::__cxx11::string::~string((string *)&local_478);
    }
    local_47c = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenTableReaderVectorFields(const FieldDef &field) {
    std::string const_string = "return o == 0 ? {{CONSTANT}} : ";
    const auto vectortype = field.value.type.VectorType();
    code_.SetValue("SIZE", NumToString(InlineSize(vectortype)));
    code_.SetValue("HAS_FIELDVAR", namer_.Variable("has", field));
    code_ += "{{ACCESS_TYPE}} var {{HAS_FIELDVAR}}: Bool { " + GenOffset() +
             "return o == 0 ? false : true }";
    code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}Count: Int32 { " + GenOffset() +
             "return o == 0 ? 0 : {{ACCESS}}.vector(count: o) }";
    code_.SetValue("CONSTANT", IsScalar(vectortype.base_type) ? "0" : "nil");
    const auto nullable =
        IsScalar(vectortype.base_type) && !IsEnum(vectortype) ? "" : "?";

    if (vectortype.base_type != BASE_TYPE_UNION) {
      code_ += GenArrayMainBody(nullable) + GenOffset() + "\\";
    } else {
      code_ +=
          "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(at "
          "index: "
          "Int32, type: T.Type) -> T? { " +
          GenOffset() + "\\";
    }

    if (IsBool(vectortype.base_type)) {
      code_.SetValue("CONSTANT", field.value.offset == 0 ? "false" : "true");
      code_.SetValue("VALUETYPE", "Bool");
    }

    if (!IsEnum(vectortype)) code_ += const_string + "\\";

    if (IsScalar(vectortype.base_type) && !IsEnum(vectortype) &&
        !IsBool(field.value.type.base_type)) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_ +=
          "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}] { return "
          "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) ?? [] }";
      if (parser_.opts.mutable_buffer) code_ += GenMutateArray();
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        field.value.type.struct_def->fixed) {
      code_ +=
          "{{ACCESS}}.directRead(of: {{VALUETYPE}}.self, offset: "
          "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
      code_.SetValue("FIELDMETHOD", namer_.Method("mutable", field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_ += GenArrayMainBody(nullable) + GenOffset() + const_string +
               GenConstructor("{{ACCESS}}.vector(at: o) + index * {{SIZE}}");

      return;
    }

    if (IsString(vectortype)) {
      code_ +=
          "{{ACCESS}}.directString(at: {{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (IsEnum(vectortype)) {
      code_.SetValue("BASEVALUE", GenTypeBasic(vectortype, false));
      code_ += "return o == 0 ? {{VALUETYPE}}" + GenEnumDefaultValue(field) +
               " : {{VALUETYPE}}(rawValue: {{ACCESS}}.directRead(of: "
               "{{BASEVALUE}}.self, offset: {{ACCESS}}.vector(at: o) + "
               "index * {{SIZE}})) }";
      return;
    }
    if (vectortype.base_type == BASE_TYPE_UNION) {
      code_ +=
          "{{ACCESS}}.directUnion({{ACCESS}}.vector(at: o) + "
          "index * {{SIZE}}) }";
      return;
    }

    if (vectortype.base_type == BASE_TYPE_STRUCT &&
        !field.value.type.struct_def->fixed) {
      code_ += GenConstructor(
          "{{ACCESS}}.indirect({{ACCESS}}.vector(at: o) + index * "
          "{{SIZE}})");
      const auto &sd = *field.value.type.struct_def;
      const auto &fields = sd.fields.vec;
      for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
        const auto &key_field = **kit;
        if (key_field.key) {
          GenByKeyFunctions(key_field);
          break;
        }
      }
    }
  }